

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

char * flatcc_json_parser_union_type
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,
                 flatcc_json_parser_integral_symbol_f **type_parsers,
                 flatcc_json_parser_union_f *union_parser)

{
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  char *buf_00;
  undefined6 in_register_00000082;
  int local_4c;
  flatcc_builder_union_ref_t local_48;
  uint8_t *local_40;
  uint local_34;
  
  pvVar5 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  if (*(char *)((long)pvVar5 + union_index * 0x28 + 0x24) != '\0') {
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x1c;
    ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
    ctx->error_loc = buf;
    return end;
  }
  local_34 = (uint)CONCAT62(in_register_00000082,id);
  *(undefined1 *)((long)pvVar5 + union_index * 0x28 + 0x24) = 1;
  local_40 = (uint8_t *)((long)pvVar5 + union_index * 0x28 + 0x25);
  local_48.type = '\0';
  local_48._1_3_ = 0;
  local_48.value = 0;
  local_4c = 0;
  *(undefined1 *)((long)pvVar5 + union_index * 0x28 + 0x25) = 0;
  buf_00 = buf;
  if ((buf == end) ||
     (pcVar6 = flatcc_json_parser_integer(ctx,buf,end,&local_4c,(uint64_t *)&local_48),
     buf_00 = pcVar6, pcVar6 == buf)) goto LAB_00125fb3;
  if (local_4c == 0) {
    if ((ulong)local_48 < 0x100) {
      *local_40 = local_48.type;
      goto LAB_00125fb3;
    }
    buf_00 = end;
    if (ctx->error != 0) goto LAB_00125fb3;
    ctx->error = 7;
  }
  else {
    buf_00 = end;
    if (ctx->error != 0) goto LAB_00125fb3;
    ctx->error = 8;
  }
  ctx->pos = ((int)pcVar6 - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = pcVar6;
  buf_00 = end;
LAB_00125fb3:
  if (buf_00 == buf) {
    buf_00 = flatcc_json_parser_symbolic_uint8(ctx,buf_00,end,type_parsers,local_40);
  }
  pcVar6 = *(char **)((long)pvVar5 + union_index * 0x28 + 0x10);
  if (pcVar6 == (char *)0x0) {
    *(long *)((long)pvVar5 + 8) = (*(long *)((long)pvVar5 + 8) + 1) - (ulong)(*local_40 == '\0');
    end = buf_00;
  }
  else {
    if (*(long *)((long)pvVar5 + 8) == 0) {
      __assert_fail("f->union_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_parser.c"
                    ,0x43b,
                    "const char *flatcc_json_parser_union_type(flatcc_json_parser_t *, const char *, const char *, size_t, flatbuffers_voffset_t, size_t, flatcc_json_parser_integral_symbol_f **, flatcc_json_parser_union_f *)"
                   );
    }
    *(long *)((long)pvVar5 + 8) = *(long *)((long)pvVar5 + 8) + -1;
    iVar2 = ctx->line;
    pcVar3 = ctx->line_start;
    ctx->line = *(int *)((long)pvVar5 + union_index * 0x28 + 0x20);
    ctx->line_start = *(char **)((long)pvVar5 + union_index * 0x28 + 0x18);
    uVar1 = *(uint8_t *)((long)pvVar5 + union_index * 0x28 + 0x25);
    local_48.type = uVar1;
    pcVar6 = (*union_parser)(ctx,pcVar6,end,uVar1,&local_48.value);
    if (pcVar6 != end) {
      iVar4 = flatcc_builder_table_add_union(ctx->ctx,local_34 & 0xffff,local_48);
      if (iVar4 == 0) {
        ctx->line = iVar2;
        ctx->line_start = pcVar3;
        end = buf_00;
      }
      else if (ctx->error == 0) {
        ctx->error = 0x1c;
        ctx->pos = ((int)buf_00 - *(int *)&ctx->line_start) + 1;
        ctx->error_loc = buf_00;
      }
    }
  }
  return end;
}

Assistant:

const char *flatcc_json_parser_union_type(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index, flatbuffers_voffset_t id,
        size_t handle,
        flatcc_json_parser_integral_symbol_f *type_parsers[],
        flatcc_json_parser_union_f *union_parser)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    flatcc_builder_union_ref_t uref;
    const char *mark;
    int line;
    const char *line_start;

    if (e->type_present) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    e->type_present = 1;
    buf = flatcc_json_parser_uint8(ctx, (mark = buf), end, &e->type);
    if (mark == buf) {
        buf = flatcc_json_parser_symbolic_uint8(ctx, buf, end, type_parsers, &e->type);
    }
    /* Only count the union if the type is not NONE. */
    if (e->backtrace == 0) {
        f->union_count += e->type != 0;
        return buf;
    }
    FLATCC_ASSERT(f->union_count);
    --f->union_count;
    /*
     * IMPORTANT: we cannot access any value in the frame or entry
     * pointer after calling union parse because it might cause the
     * stack to reallocate. We should read the frame pointer again if
     * needed - we don't but remember it if refactoring code.
     *
     * IMPORTANT 2: Do not assign buf here. We are backtracking.
     */
    line = ctx->line;
    line_start = ctx->line_start;
    ctx->line = e->line;
    ctx->line_start = e->line_start;
    uref.type = e->type;
    if (end == union_parser(ctx, e->backtrace, end, e->type, &uref.value)) {
        return end;
    }
    if (flatcc_builder_table_add_union(ctx->ctx, id, uref)) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    ctx->line = line;
    ctx->line_start = line_start;
    return buf;
}